

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

bool __thiscall
ChainstateManager::ProcessNewBlock
          (ChainstateManager *this,shared_ptr<const_CBlock> *block,bool force_processing,
          bool min_pow_checked,bool *new_block)

{
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  bool bVar1;
  byte bVar2;
  Chainstate *flag;
  ConstevalFormatString<2U> fmt;
  long in_RDI;
  ChainstateManager *in_R8;
  long in_FS_OFFSET;
  Chainstate *bg_chain;
  bool ret;
  CBlockIndex *pindex;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock34;
  BlockValidationState bg_state;
  BlockValidationState state;
  BlockValidationState state_1;
  ChainstateManager *in_stack_fffffffffffffd18;
  undefined4 uVar3;
  char *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  char *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  undefined6 in_stack_fffffffffffffd40;
  undefined1 in_stack_fffffffffffffd46;
  undefined1 in_stack_fffffffffffffd47;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffd48;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffd50;
  undefined6 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5e;
  undefined1 in_stack_fffffffffffffd5f;
  byte bVar4;
  undefined7 in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd6f;
  CBlock *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  LogFlags in_stack_fffffffffffffd80;
  undefined8 in_stack_fffffffffffffd88;
  int source_line;
  ConstevalFormatString<2U> in_stack_fffffffffffffdc8;
  undefined8 in_stack_fffffffffffffdd0;
  char *pcVar5;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  int iVar6;
  char *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffdec;
  bool local_1e1;
  undefined1 in_stack_fffffffffffffe26;
  undefined1 in_stack_fffffffffffffe27;
  Params *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  CBlock *in_stack_fffffffffffffe38;
  BlockValidationState *in_stack_fffffffffffffe40;
  shared_ptr<const_CBlock> *in_stack_fffffffffffffe48;
  ChainstateManager *in_stack_fffffffffffffe50;
  Level in_stack_fffffffffffffec0;
  char (*in_stack_fffffffffffffed0) [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  shared_ptr<const_CBlock> *in_stack_fffffffffffffee0;
  BlockValidationState *in_stack_fffffffffffffee8;
  Chainstate *in_stack_fffffffffffffef0;
  bool *in_stack_ffffffffffffff80;
  char local_70 [104];
  long local_8;
  
  source_line = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockNotHeldInline
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
             (int)((ulong)in_stack_fffffffffffffd18 >> 0x20),(RecursiveMutex *)0x14a270a);
  if (in_R8 != (ChainstateManager *)0x0) {
    *(undefined1 *)
     &(in_R8->m_ibd_chainstate)._M_t.
      super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
      super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
      super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl = 0;
  }
  BlockValidationState::BlockValidationState((BlockValidationState *)in_stack_fffffffffffffd18);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd18);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_fffffffffffffd5f,
                      CONCAT16(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58)),
             in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
             (char *)CONCAT17(in_stack_fffffffffffffd47,
                              CONCAT16(in_stack_fffffffffffffd46,in_stack_fffffffffffffd40)),
             in_stack_fffffffffffffd3c,SUB41((uint)in_stack_fffffffffffffd38 >> 0x18,0));
  std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffd28);
  GetConsensus(in_stack_fffffffffffffd18);
  bVar1 = CheckBlock(in_stack_fffffffffffffe38,
                     (BlockValidationState *)
                     CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                     in_stack_fffffffffffffe28,(bool)in_stack_fffffffffffffe27,
                     (bool)in_stack_fffffffffffffe26);
  uVar7 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffde8);
  if (bVar1) {
    bVar1 = AcceptBlock(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                        in_stack_fffffffffffffe40,(CBlockIndex **)in_stack_fffffffffffffe38,
                        (bool)in_stack_fffffffffffffe37,(FlatFilePos *)in_stack_fffffffffffffe28,
                        in_stack_ffffffffffffff80,(bool)in_stack_fffffffffffffe27);
    uVar7 = CONCAT13(bVar1,(int3)uVar7);
    in_stack_fffffffffffffd18 = in_R8;
  }
  if ((char)((uint)uVar7 >> 0x18) == '\0') {
    if (*(long *)(in_RDI + 0x7d8) != 0) {
      source_line = (int)((ulong)*(undefined8 *)(in_RDI + 0x7d8) >> 0x20);
      std::__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
                ((__shared_ptr_access<const_CBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 in_stack_fffffffffffffd28);
      ValidationSignals::BlockChecked
                ((ValidationSignals *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
                 in_stack_fffffffffffffd70,
                 (BlockValidationState *)
                 CONCAT17(in_stack_fffffffffffffd6f,in_stack_fffffffffffffd68));
    }
    uVar3 = (undefined4)((ulong)in_stack_fffffffffffffd18 >> 0x20);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
               in_stack_fffffffffffffd30);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
               in_stack_fffffffffffffd30);
    in_stack_fffffffffffffde0 = "%s: AcceptBlock FAILED (%s)\n";
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              ((ValidationState<BlockValidationResult> *)
               CONCAT17(in_stack_fffffffffffffd5f,
                        CONCAT16(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58)));
    in_stack_fffffffffffffd30 = local_70;
    in_stack_fffffffffffffd28 = "ProcessNewBlock";
    in_stack_fffffffffffffd18 = (ChainstateManager *)CONCAT44(uVar3,4);
    logging_function._M_str._0_4_ = uVar7;
    logging_function._M_len = (size_t)in_stack_fffffffffffffde0;
    logging_function._M_str._4_4_ = in_stack_fffffffffffffdec;
    source_file._M_str._0_4_ = in_stack_fffffffffffffdd8;
    source_file._M_len = in_stack_fffffffffffffdd0;
    source_file._M_str._4_4_ = in_stack_fffffffffffffddc;
    LogPrintFormatInternal<char[16],std::__cxx11::string>
              (logging_function,source_file,source_line,in_stack_fffffffffffffd80,
               in_stack_fffffffffffffec0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffed0,
               in_stack_fffffffffffffed8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffd18);
    local_1e1 = false;
    iVar6 = 1;
  }
  else {
    iVar6 = 0;
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd18);
  BlockValidationState::~BlockValidationState((BlockValidationState *)in_stack_fffffffffffffd18);
  if (iVar6 == 0) {
    NotifyHeaderTip((ChainstateManager *)
                    CONCAT17(in_stack_fffffffffffffd5f,
                             CONCAT16(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58)));
    BlockValidationState::BlockValidationState((BlockValidationState *)in_stack_fffffffffffffd18);
    flag = ActiveChainstate((ChainstateManager *)in_stack_fffffffffffffd28);
    std::shared_ptr<const_CBlock>::shared_ptr
              ((shared_ptr<const_CBlock> *)in_stack_fffffffffffffd18,
               (shared_ptr<const_CBlock> *)0x14a2a65);
    bVar1 = Chainstate::ActivateBestChain
                      (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0
                      );
    bVar2 = bVar1 ^ 0xff;
    std::shared_ptr<const_CBlock>::~shared_ptr
              ((shared_ptr<const_CBlock> *)in_stack_fffffffffffffd18);
    if ((bVar2 & 1) == 0) {
      MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd18);
      fmt.fmt = (char *)ProcessNewBlock::anon_class_8_1_8991fb9c::operator()
                                  (in_stack_fffffffffffffd48);
      BlockValidationState::BlockValidationState((BlockValidationState *)in_stack_fffffffffffffd18);
      bVar4 = 0;
      bVar2 = bVar4;
      if ((pointer)fmt.fmt != (pointer)0x0) {
        std::shared_ptr<const_CBlock>::shared_ptr
                  ((shared_ptr<const_CBlock> *)in_stack_fffffffffffffd18,
                   (shared_ptr<const_CBlock> *)0x14a2c98);
        in_stack_fffffffffffffd5e =
             Chainstate::ActivateBestChain
                       (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                        in_stack_fffffffffffffee0);
        bVar4 = in_stack_fffffffffffffd5e ^ 0xff;
        bVar2 = bVar4;
        std::shared_ptr<const_CBlock>::~shared_ptr
                  ((shared_ptr<const_CBlock> *)in_stack_fffffffffffffd18);
      }
      bVar1 = (bVar4 & 1) != 0;
      if (bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                   in_stack_fffffffffffffd30);
        uVar3 = (undefined4)((ulong)in_stack_fffffffffffffd18 >> 0x20);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                   in_stack_fffffffffffffd30);
        ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                  ((ValidationState<BlockValidationResult> *)
                   CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58)));
        in_stack_fffffffffffffd18 = (ChainstateManager *)CONCAT44(uVar3,4);
        logging_function_01._M_str._0_4_ = uVar7;
        logging_function_01._M_len = (size_t)in_stack_fffffffffffffde0;
        logging_function_01._M_str._4_4_ = in_stack_fffffffffffffdec;
        source_file_01._M_str._0_4_ = in_stack_fffffffffffffdd8;
        source_file_01._M_len = in_stack_fffffffffffffdd0;
        source_file_01._M_str._4_4_ = iVar6;
        LogPrintFormatInternal<char[16],std::__cxx11::string>
                  (logging_function_01,source_file_01,source_line,(LogFlags)flag,
                   in_stack_fffffffffffffec0,fmt,in_stack_fffffffffffffed0,in_stack_fffffffffffffed8
                  );
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffd18);
      }
      local_1e1 = !bVar1;
      BlockValidationState::~BlockValidationState((BlockValidationState *)in_stack_fffffffffffffd18)
      ;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30);
      uVar3 = (undefined4)((ulong)in_stack_fffffffffffffd18 >> 0x20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30);
      pcVar5 = "%s: ActivateBestChain failed (%s)\n";
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                ((ValidationState<BlockValidationResult> *)
                 CONCAT17(in_stack_fffffffffffffd5f,
                          CONCAT16(in_stack_fffffffffffffd5e,in_stack_fffffffffffffd58)));
      in_stack_fffffffffffffd18 = (ChainstateManager *)CONCAT44(uVar3,4);
      logging_function_00._M_str._0_4_ = uVar7;
      logging_function_00._M_len = (size_t)in_stack_fffffffffffffde0;
      logging_function_00._M_str._4_4_ = in_stack_fffffffffffffdec;
      source_file_00._M_str._0_4_ = in_stack_fffffffffffffdd8;
      source_file_00._M_len = (size_t)pcVar5;
      source_file_00._M_str._4_4_ = iVar6;
      LogPrintFormatInternal<char[16],std::__cxx11::string>
                (logging_function_00,source_file_00,source_line,(LogFlags)flag,
                 in_stack_fffffffffffffec0,in_stack_fffffffffffffdc8,in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffed8);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffd18);
      local_1e1 = false;
    }
    BlockValidationState::~BlockValidationState((BlockValidationState *)in_stack_fffffffffffffd18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(local_1e1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool ChainstateManager::ProcessNewBlock(const std::shared_ptr<const CBlock>& block, bool force_processing, bool min_pow_checked, bool* new_block)
{
    AssertLockNotHeld(cs_main);

    {
        CBlockIndex *pindex = nullptr;
        if (new_block) *new_block = false;
        BlockValidationState state;

        // CheckBlock() does not support multi-threaded block validation because CBlock::fChecked can cause data race.
        // Therefore, the following critical section must include the CheckBlock() call as well.
        LOCK(cs_main);

        // Skipping AcceptBlock() for CheckBlock() failures means that we will never mark a block as invalid if
        // CheckBlock() fails.  This is protective against consensus failure if there are any unknown forms of block
        // malleability that cause CheckBlock() to fail; see e.g. CVE-2012-2459 and
        // https://lists.linuxfoundation.org/pipermail/bitcoin-dev/2019-February/016697.html.  Because CheckBlock() is
        // not very expensive, the anti-DoS benefits of caching failure (of a definitely-invalid block) are not substantial.
        bool ret = CheckBlock(*block, state, GetConsensus());
        if (ret) {
            // Store to disk
            ret = AcceptBlock(block, state, &pindex, force_processing, nullptr, new_block, min_pow_checked);
        }
        if (!ret) {
            if (m_options.signals) {
                m_options.signals->BlockChecked(*block, state);
            }
            LogError("%s: AcceptBlock FAILED (%s)\n", __func__, state.ToString());
            return false;
        }
    }

    NotifyHeaderTip();

    BlockValidationState state; // Only used to report errors, not invalidity - ignore it
    if (!ActiveChainstate().ActivateBestChain(state, block)) {
        LogError("%s: ActivateBestChain failed (%s)\n", __func__, state.ToString());
        return false;
    }

    Chainstate* bg_chain{WITH_LOCK(cs_main, return BackgroundSyncInProgress() ? m_ibd_chainstate.get() : nullptr)};
    BlockValidationState bg_state;
    if (bg_chain && !bg_chain->ActivateBestChain(bg_state, block)) {
        LogError("%s: [background] ActivateBestChain failed (%s)\n", __func__, bg_state.ToString());
        return false;
     }

    return true;
}